

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int luaD_precall(lua_State *L,StkId func,int nresults,int op_call)

{
  Instruction **ppIVar1;
  byte bVar2;
  byte bVar3;
  lua_CFunction p_Var4;
  int *piVar5;
  Proto *p;
  Instruction *pIVar6;
  CallInfo *pCVar7;
  char cVar8;
  bool bVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  TValue *pTVar13;
  CallInfo *pCVar14;
  uint uVar15;
  StkId pTVar16;
  StkId pTVar17;
  LuaType *pLVar18;
  uint uVar19;
  ulong uVar20;
  char *pcVar21;
  lua_State *plVar22;
  TValue *io1;
  lua_Number in_XMM0_Qa;
  ravi_compile_options_t local_38;
  
  plVar22 = L;
  do {
    uVar10 = func->tt_;
    uVar15 = (uVar10 & 0x7f) - 6;
    switch(uVar15 >> 4 | uVar15 * 0x10000000) {
    case 0:
      if (uVar10 == 0x8006) {
        if ((func->value_).f[8] == (_func_int_lua_State_ptr)0x6) {
          p = *(Proto **)((func->value_).f + 0x18);
          uVar20 = (long)L->top - (long)func;
          bVar2 = p->maxstacksize;
          if ((long)L->stack_last - (long)L->top >> 4 <= (long)(ulong)bVar2) {
            pTVar17 = L->stack;
            if (0 < L->l_G->GCdebt) {
              luaC_step(L);
            }
            luaD_growstack(L,(uint)bVar2);
            func = (StkId)(((long)func - (long)pTVar17) + (long)L->stack);
          }
          bVar3 = p->numparams;
          uVar15 = (uint)bVar3;
          iVar12 = (int)(uVar20 >> 4);
          if (p->is_vararg == '\0') {
            if (iVar12 <= (int)uVar15) {
              pTVar17 = L->top;
              iVar12 = (uVar15 - iVar12) + 1;
              do {
                pTVar17->tt_ = 0;
                pTVar17 = pTVar17 + 1;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
              L->top = pTVar17;
            }
            pTVar17 = func + 1;
          }
          else {
            pTVar17 = L->top;
            uVar20 = 0;
            if ((1 < iVar12) && (bVar3 != 0)) {
              uVar19 = iVar12 - 2U;
              if (bVar3 - 1 <= iVar12 - 2U) {
                uVar19 = bVar3 - 1;
              }
              pLVar18 = &pTVar17[-(long)(iVar12 + -1)].tt_;
              uVar20 = 0;
              do {
                pTVar16 = L->top;
                L->top = pTVar16 + 1;
                pTVar16->value_ = ((TValue *)(pLVar18 + -4))->value_;
                uVar10 = *pLVar18;
                pTVar16->tt_ = uVar10;
                if (((short)uVar10 < 0) &&
                   (((uVar10 & 0x7f) != (ushort)((pTVar16->value_).gc)->tt ||
                    ((L != (lua_State *)0x0 &&
                     ((((pTVar16->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                                ,0x13d,"StkId adjust_varargs(lua_State *, Proto *, int)");
                }
                *pLVar18 = 0;
                uVar20 = uVar20 + 1;
                pLVar18 = pLVar18 + 8;
              } while (uVar19 + 1 != uVar20);
            }
            iVar12 = uVar15 - (uint)uVar20;
            if ((uint)uVar20 <= uVar15 && iVar12 != 0) {
              pTVar16 = L->top;
              do {
                pTVar16->tt_ = 0;
                pTVar16 = pTVar16 + 1;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
              L->top = pTVar16;
            }
          }
          pCVar14 = L->ci->next;
          if (pCVar14 == (CallInfo *)0x0) {
            pCVar14 = luaE_extendCI(L);
          }
          L->ci = pCVar14;
          pCVar14->nresults = (short)nresults;
          pCVar14->func = func;
          (pCVar14->u).l.base = pTVar17;
          pTVar17 = pTVar17 + bVar2;
          pCVar14->top = pTVar17;
          L->top = pTVar17;
          if (L->stack_last < pTVar17) {
            __assert_fail("ci->top <= L->stack_last",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                          ,0x1dd,"int luaD_precall(lua_State *, StkId, int, int)");
          }
          pIVar6 = p->code;
          (pCVar14->u).l.savedpc = pIVar6;
          pCVar14->callstatus = 2;
          pCVar14->jitstatus = '\0';
          if ((L->hookmask & 1) != 0) {
            (pCVar14->u).l.savedpc = pIVar6 + 1;
            pCVar7 = pCVar14->previous;
            iVar12 = 0;
            if ((((pCVar7->callstatus & 2) != 0) && (iVar12 = 0, pCVar7->jitstatus == '\0')) &&
               (iVar12 = 0, *(char *)((pCVar7->u).c.old_errfunc + -4) == '%')) {
              pCVar14->callstatus = 0x22;
              iVar12 = 4;
            }
            luaD_hook(L,iVar12,-1);
            ppIVar1 = &(pCVar14->u).l.savedpc;
            *ppIVar1 = *ppIVar1 + -1;
          }
          if ((L->l_G->mainthread == L) && ((p->ravi_jit).jit_status == '\0')) {
            local_38 = (ravi_compile_options_t)0x0;
            raviV_compile(L,p,&local_38);
          }
          iVar12 = 0;
          if ((L->l_G->mainthread == L) &&
             (iVar12 = 0, (p->ravi_jit).jit_function != (lua_CFunction)0x0)) {
            pCVar14->jitstatus = '\x01';
            ppIVar1 = &(pCVar14->u).l.savedpc;
            *ppIVar1 = *ppIVar1 + 1;
            uVar10 = L->nCcalls + 1;
            L->nCcalls = uVar10;
            if (0x7c < uVar10) {
              if (uVar10 == 0x7d) {
                pcVar21 = "stack overflow";
LAB_0012b8f0:
                luaG_runerror(L,pcVar21);
              }
              if (0x8b < uVar10) {
                luaD_throw(L,6);
              }
            }
            L->nny = L->nny + 1;
            iVar11 = (*(p->ravi_jit).jit_function)(L);
            L->nny = L->nny - 1;
            L->nCcalls = L->nCcalls - 1;
            iVar12 = 2;
            if ((op_call != 0) && (iVar11 != 0)) {
              if ((L->ci->callstatus & 2) == 0) {
                __assert_fail("((L->ci)->callstatus & (1<<1))",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                              ,0x205,"int luaD_precall(lua_State *, StkId, int, int)");
              }
              L->top = L->ci->top;
            }
          }
          return iVar12;
        }
        pcVar21 = "(((func)->value_).gc)->tt == ((6) | ((0) << 4))";
      }
      else {
        pcVar21 = "((((func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
      }
      __assert_fail(pcVar21,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1cd,"int luaD_precall(lua_State *, StkId, int, int)");
    case 1:
      pTVar17 = func;
      if (uVar10 != 0x16) {
        __assert_fail("((((func))->tt_) == (((6) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1b7,"int luaD_precall(lua_State *, StkId, int, int)");
      }
LAB_0012b418:
      p_Var4 = (pTVar17->value_).f;
      if ((long)L->stack_last - (long)L->top < 0x150) {
        pTVar17 = L->stack;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,0x14);
        func = (StkId)(((long)func - (long)pTVar17) + (long)L->stack);
      }
      pCVar14 = L->ci->next;
      if (pCVar14 == (CallInfo *)0x0) {
        pCVar14 = luaE_extendCI(L);
      }
      L->ci = pCVar14;
      pCVar14->nresults = (short)nresults;
      pCVar14->func = func;
      pTVar17 = L->top;
      pCVar14->top = pTVar17 + 0x14;
      if (L->stack_last < pTVar17 + 0x14) {
        __assert_fail("ci->top <= L->stack_last",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1bf,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      pCVar14->callstatus = 0;
      pCVar14->jitstatus = '\0';
      if ((L->hookmask & 1) != 0) {
        luaD_hook(L,0,-1);
      }
      piVar5 = *(int **)&L[-1].hookmask;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 != 0) {
        __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1c4,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      iVar11 = (*p_Var4)(L);
      iVar12 = **(int **)&L[-1].hookmask;
      **(int **)&L[-1].hookmask = iVar12 + 1;
      if (iVar12 != 0) {
        __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x1c6,"int luaD_precall(lua_State *, StkId, int, int)");
      }
      if ((long)iVar11 < (long)L->top - (long)L->ci->func >> 4) {
        luaD_poscall(L,pCVar14,L->top + -(long)iVar11,iVar11);
        return 1;
      }
      __assert_fail("((n) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1c7,"int luaD_precall(lua_State *, StkId, int, int)");
    case 2:
      if (uVar10 == 0x8026) {
        if ((func->value_).f[8] == (_func_int_lua_State_ptr)0x26) {
          pTVar17 = (StkId)((func->value_).f + 0x18);
          goto LAB_0012b418;
        }
        pcVar21 = "(((func)->value_).gc)->tt == ((6) | ((2) << 4))";
      }
      else {
        pcVar21 = "((((func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))";
      }
      __assert_fail(pcVar21,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x1b4,"int luaD_precall(lua_State *, StkId, int, int)");
    default:
      if ((long)L->stack_last - (long)L->top < 0x11) {
        pTVar17 = L->stack;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,1);
        func = (StkId)(((long)func - (long)pTVar17) + (long)L->stack);
      }
      plVar22 = L;
      pTVar13 = luaT_gettmbyobj(L,func,TM_CALL);
      if ((pTVar13->tt_ & 0xf) != 6) {
        luaG_typeerror(L,func,"call");
      }
      for (pTVar17 = L->top; func < pTVar17; pTVar17 = pTVar17 + -1) {
        pTVar17->value_ = pTVar17[-1].value_;
        uVar10 = pTVar17[-1].tt_;
        pTVar17->tt_ = uVar10;
        if ((short)uVar10 < 0) {
          bVar2 = ((pTVar17->value_).gc)->tt;
          plVar22 = (lua_State *)(ulong)bVar2;
          if (((uVar10 & 0x7f) != (ushort)bVar2) ||
             ((L != (lua_State *)0x0 &&
              ((((pTVar17->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                          ,0x152,"void tryfuncTM(lua_State *, StkId)");
          }
        }
      }
      L->top = L->top + 1;
      func->value_ = pTVar13->value_;
      uVar10 = pTVar13->tt_;
      func->tt_ = uVar10;
      if (((short)uVar10 < 0) &&
         (((uVar10 & 0x7f) != (ushort)((func->value_).gc)->tt ||
          ((L != (lua_State *)0x0 &&
           ((((func->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x154,"void tryfuncTM(lua_State *, StkId)");
      }
      break;
    case 4:
      cVar8 = (char)(uVar10 >> 8);
      if (((byte)(cVar8 - 1U) < 3) && (((long)L->top - (long)func & 0xffffffff0U) == 0x20)) {
        pTVar17 = func + 1;
        if (func[1].tt_ == 0x13) {
          in_XMM0_Qa = (lua_Number)(pTVar17->value_).i;
LAB_0012b835:
          bVar9 = false;
        }
        else {
          if (func[1].tt_ == 3) {
            in_XMM0_Qa = (pTVar17->value_).n;
            goto LAB_0012b835;
          }
          bVar9 = true;
        }
        if (!bVar9) {
          if (cVar8 == '\x02') {
            in_XMM0_Qa = log(in_XMM0_Qa);
          }
          else if (uVar10 >> 8 == 1) {
            in_XMM0_Qa = exp(in_XMM0_Qa);
          }
          else {
            if ((uVar10 & 0x7f) != 0x46) {
              __assert_fail("((((func)->tt_) & 0x7F) == ((6) | ((4) << 4)))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                            ,0x229,"int luaD_precall(lua_State *, StkId, int, int)");
            }
            (*(func->value_).f)(plVar22);
          }
          (func->value_).n = in_XMM0_Qa;
          func->tt_ = 3;
          L->top = pTVar17;
          return 1;
        }
      }
      pcVar21 = "Unsupported fastcall to C function";
      goto LAB_0012b8f0;
    }
  } while( true );
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults, int op_call) {
  lua_CFunction f;
  CallInfo *ci;
  switch (ttype(func)) {
    case LUA_TCCL:  /* C closure */
      f = clCvalue(func)->f;
      goto Cfunc;
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
     Cfunc: {
      int n;  /* number of returns */
      checkstackp(L, LUA_MINSTACK, func);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      ci->jitstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, ci, L->top - n, n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      int n = cast_int(L->top - func) - 1;  /* number of real arguments */
      int fsize = p->maxstacksize;  /* frame size */
      checkstackp(L, fsize, func);
      if (p->is_vararg)
        base = adjust_varargs(L, p, n);
      else {  /* non vararg function */
        for (; n < p->numparams; n++)
          setnilvalue(L->top++);  /* complete missing arguments */
        base = func + 1;
      }
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      L->top = ci->top = base + fsize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      ci->jitstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      if (L == G(L)->mainthread && p->ravi_jit.jit_status == RAVI_JIT_NOT_COMPILED) {
        /* not compiled */
        ravi_compile_options_t options;
        memset(&options, 0, sizeof options);
        raviV_compile(L, p, &options);
      }
      if (L == G(L)->mainthread && p->ravi_jit.jit_function) {
        /* compiled */
        ci->jitstatus = 1;
        /* Since the JITed function does not update savedpc
         * other than for calls by default - the stack trace error
         * message below will be unable to find the line info
         * as savedpc is not set correctly - so we set this here
         * prior to the call
         */
        ci->u.l.savedpc++;
        /* As JITed function is like a C function
         * employ the same restrictions on recursive
         * calls as for C functions
         */
        if (++L->nCcalls >= LUAI_MAXCCALLS) {
          if (L->nCcalls == LUAI_MAXCCALLS)
            luaG_runerror(L, "stack overflow");
          else if (L->nCcalls >= (LUAI_MAXCCALLS + (LUAI_MAXCCALLS >> 3)))
            luaD_throw(L, LUA_ERRERR); /* error while handing stack error */
        }
        /* Disable YIELDs - so JITed functions cannot
         * yield
         */
        L->nny++;
        int b = (*p->ravi_jit.jit_function)(L);
        L->nny--;
        L->nCcalls--;
        if (op_call && b) {
          lua_assert(isLua(L->ci));
          /* b is the value returned by luaD_poscall()
           */
          L->top = L->ci->top;
        }
        /* Return a different value from 1 to
         * allow luaV_execute() to distinguish between
         * JITed function and true C function
         */
        return 2;
      }
      return 0;
    }
    case RAVI_TFCF: {
      int nargs = (int)(L->top - func - 1);
      int tt = rttype(func);
      int sig = getfcf_tag(tt); /* Extract the function signature */
      switch (sig) {
        case RAVI_TFCF_LOG:
        case RAVI_TFCF_EXP:
        case RAVI_TFCF_D_D: {
          if (nargs == 1) {
            TValue *arg1 = func + 1;
            double arg;
            if (ttisfloat(arg1))
              arg = fltvalue(arg1);
            else if (ttisinteger(arg1))
              arg = (double)ivalue(arg1);
            else
              nargs = 0;
            if (nargs) {
              double v;
              switch (sig) {
                case RAVI_TFCF_EXP: v = exp(arg); break;
                case RAVI_TFCF_LOG: v = log(arg); break;
                default: {
                  double(*f)(double) = fcfvalue(func);
                  v = f(arg);
                  break;
                }
              }
              setfltvalue(func, v);
              L->top = func + 1; /* top points after the last result */
              return 1;
            }
          }
          break;
        }
        default: { break; }
      }
      luaG_runerror(L, "Unsupported fastcall to C function");
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* ensure space for metamethod */
      tryfuncTM(L, func);  /* try to get '__call' metamethod */
      return luaD_precall(L, func, nresults, op_call);  /* now it must be a function */
    }
  }
}